

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::createAtomicOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration param_2,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy,
          CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  Builder *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Decoration typeId_00;
  int iVar7;
  Id IVar8;
  uint uVar9;
  Id IVar10;
  undefined8 in_RAX;
  long lVar11;
  undefined7 uVar12;
  undefined4 in_register_0000000c;
  long *plVar13;
  uint *puVar14;
  uint uVar15;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvAtomicOperands;
  Id semanticsId;
  Id valueId;
  Id semanticsId2;
  Id compareId;
  Id pointerId;
  byte local_8c;
  byte local_88;
  Op local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Id local_60;
  undefined4 local_5c;
  Id local_58;
  uint local_54;
  Id local_50;
  uint local_4c;
  uint local_48;
  Decoration local_44;
  undefined8 local_40;
  byte *local_38;
  
  local_40 = CONCAT44(in_register_00000034,op);
  plVar13 = (long *)CONCAT44(in_register_0000000c,typeId);
  local_5c = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_38 = (byte *)CONCAT44(in_register_0000008c,typeProxy);
  uVar15 = (uint)operands;
  local_44 = param_2;
  if (0x16 < op - EOpAtomicAdd) {
    if (9 < op - EOpImageAtomicAdd) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x20a1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator, spv::Decoration, spv::Id, std::vector<spv::Id> &, glslang::TBasicType, const spv::Builder::AccessChain::CoherentFlags &, const glslang::TType &)"
                   );
    }
    lVar11 = (long)&switchD_0044bba8::switchdataD_00867038 +
             (long)(int)(&switchD_0044bba8::switchdataD_00867038)[op - EOpImageAtomicAdd];
    switch(op) {
    case EOpImageAtomicMin:
      goto switchD_0044bb7c_caseD_12f;
    case EOpImageAtomicMax:
      goto switchD_0044bb7c_caseD_130;
    case EOpImageAtomicAnd:
      goto switchD_0044bb7c_caseD_131;
    case EOpImageAtomicOr:
      goto switchD_0044bb7c_caseD_132;
    case EOpImageAtomicXor:
      goto switchD_0044bb7c_caseD_133;
    case EOpImageAtomicExchange:
      goto switchD_0044bb7c_caseD_134;
    case EOpImageAtomicCompSwap:
      goto switchD_0044bb7c_caseD_135;
    case EOpImageAtomicLoad:
      goto switchD_0044bb7c_caseD_136;
    case EOpImageAtomicStore:
      goto switchD_0044bb7c_caseD_137;
    }
switchD_0044bb7c_caseD_12d:
    if (uVar15 - 1 < 3) {
      if (uVar15 == 3) {
        iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
        if (iVar7 != 2) {
          iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
          if (iVar7 != 4) goto LAB_0044be8b;
        }
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_78.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x151c);
      }
      else {
LAB_0044be8b:
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_add");
        if (uVar15 == 3) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float16_add");
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x17cf);
        }
        else if (uVar15 == 1) {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x1791);
        }
        else {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x1792);
        }
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_78);
      local_7c = OpAtomicFAddEXT;
    }
    else {
      local_7c = OpAtomicIAdd;
    }
    goto LAB_0044bf74;
  }
  lVar11 = (long)&switchD_0044bb7c::switchdataD_00866fdc +
           (long)(int)(&switchD_0044bb7c::switchdataD_00866fdc)[op - EOpAtomicAdd];
  uVar12 = (undefined7)((ulong)lVar11 >> 8);
  switch(op) {
  default:
    goto switchD_0044bb7c_caseD_12d;
  case EOpAtomicSubtract:
  case EOpAtomicCounterSubtract:
    local_7c = OpAtomicISub;
    break;
  case EOpAtomicMin:
  case EOpAtomicCounterMin:
switchD_0044bb7c_caseD_12f:
    if (uVar15 - 1 < 3) {
      if (uVar15 == 3) {
        iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
        if ((iVar7 == 2) ||
           (iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
           iVar7 == 4)) {
          spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x151c);
        }
        else {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15f0);
        }
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
        if (uVar15 == 1) {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ec);
        }
        else {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ed);
        }
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_78);
      local_7c = OpAtomicFMinEXT;
    }
    else {
      local_7c = (uVar15 & 0xfffffffd) == 9 | OpAtomicSMin;
    }
    break;
  case EOpAtomicMax:
  case EOpAtomicCounterMax:
switchD_0044bb7c_caseD_130:
    if (uVar15 - 1 < 3) {
      if (uVar15 == 3) {
        iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
        if ((iVar7 == 2) ||
           (iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
           iVar7 == 4)) {
          spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x151c);
        }
        else {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15f0);
        }
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
        if (uVar15 == 1) {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ec);
        }
        else {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x15ed);
        }
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_78);
      local_7c = OpAtomicFMaxEXT;
    }
    else {
      local_7c = (uVar15 & 0xfffffffd) == 9 | OpAtomicSMax;
    }
    break;
  case EOpAtomicAnd:
  case EOpAtomicCounterAnd:
switchD_0044bb7c_caseD_131:
    local_7c = OpAtomicAnd;
    break;
  case EOpAtomicOr:
  case EOpAtomicCounterOr:
switchD_0044bb7c_caseD_132:
    local_7c = OpAtomicOr;
    break;
  case EOpAtomicXor:
  case EOpAtomicCounterXor:
switchD_0044bb7c_caseD_133:
    local_7c = OpAtomicXor;
    break;
  case EOpAtomicExchange:
  case EOpAtomicCounterExchange:
switchD_0044bb7c_caseD_134:
    local_7c = OpAtomicExchange;
    if ((uVar15 == 3) &&
       ((iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags), iVar7 == 2
        || (iVar7 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
           iVar7 == 4)))) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,0x151c);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)&local_78);
    }
    break;
  case EOpAtomicCompSwap:
  case EOpAtomicCounterCompSwap:
switchD_0044bb7c_caseD_135:
    local_7c = OpAtomicCompareExchange;
    bVar6 = true;
    bVar4 = false;
    local_5c = (undefined4)CONCAT71((int7)((ulong)lVar11 >> 8),1);
    goto LAB_0044bf8f;
  case EOpAtomicLoad:
  case EOpAtomicCounter:
switchD_0044bb7c_caseD_136:
    local_7c = OpAtomicLoad;
    bVar4 = true;
    bVar6 = false;
    local_5c = 0;
    goto LAB_0044bf8f;
  case EOpAtomicStore:
switchD_0044bb7c_caseD_137:
    local_7c = OpAtomicStore;
    local_5c = (undefined4)CONCAT71((int7)((ulong)lVar11 >> 8),1);
    bVar2 = false;
    bVar3 = false;
    bVar6 = false;
    bVar4 = false;
    local_88 = 1;
    local_8c = 1;
    bVar5 = true;
    goto LAB_0044bfa3;
  case EOpAtomicCounterIncrement:
    local_7c = OpAtomicIIncrement;
    bVar2 = true;
    bVar6 = false;
    bVar4 = false;
    local_5c = (undefined4)CONCAT71(uVar12,1);
    local_88 = 0;
    goto LAB_0044bf95;
  case EOpAtomicCounterDecrement:
    local_7c = OpAtomicIDecrement;
    bVar3 = true;
    bVar2 = false;
    bVar6 = false;
    bVar4 = false;
    local_5c = (undefined4)CONCAT71(uVar12,1);
    local_88 = 1;
    local_8c = 0;
    goto LAB_0044bf9b;
  }
LAB_0044bf74:
  bVar6 = false;
  bVar4 = false;
LAB_0044bf8f:
  bVar2 = false;
  local_88 = 1;
LAB_0044bf95:
  bVar3 = false;
  local_8c = 1;
LAB_0044bf9b:
  bVar5 = false;
LAB_0044bfa3:
  if ((uVar15 & 0xfffffffe) == 10) {
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xc);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_78);
  }
  uVar15 = 0;
  local_48 = 0;
  local_4c = 0;
  local_54 = 0;
  bVar1 = this->glslangIntermediate->useVulkanMemoryModel;
  this_00 = &this->builder;
  IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
  local_60 = spv::Builder::makeIntConstant(this_00,IVar8,(uint)bVar1 * 4 + 1,false);
  if ((*local_38 & 0x80) != 0) {
    uVar15 = (uint)this->glslangIntermediate->useVulkanMemoryModel << 0xf;
  }
  IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
  local_58 = spv::Builder::makeIntConstant(this_00,IVar8,uVar15,false);
  typeId_00 = local_44;
  puVar14 = (uint *)*plVar13;
  local_48 = *puVar14;
  local_50 = local_58;
  if (!bVar2 && !bVar3) {
    if (bVar6) {
      local_4c = puVar14[1];
      local_54 = puVar14[2];
      if (0xc < (ulong)(plVar13[1] - (long)puVar14)) {
        local_60 = puVar14[3];
        uVar15 = spv::Builder::getConstantScalar(this_00,puVar14[4]);
        uVar9 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar13 + 0x14));
        IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
        local_58 = spv::Builder::makeIntConstant(this_00,IVar8,uVar15 | uVar9,false);
        uVar15 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar13 + 0x18));
        uVar9 = spv::Builder::getConstantScalar(this_00,*(Id *)(*plVar13 + 0x1c));
        IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
        local_50 = spv::Builder::makeIntConstant(this_00,IVar8,uVar15 | uVar9,false);
      }
    }
    else if (bVar4) {
      if (4 < (ulong)(plVar13[1] - (long)puVar14)) {
        local_60 = puVar14[1];
        uVar15 = spv::Builder::getConstantScalar(this_00,puVar14[2]);
        IVar8 = *(Id *)(*plVar13 + 0xc);
LAB_0044c391:
        uVar9 = spv::Builder::getConstantScalar(this_00,IVar8);
        IVar8 = spv::Builder::makeIntegerType(this_00,0x20,false);
        local_58 = spv::Builder::makeIntConstant(this_00,IVar8,uVar15 | uVar9,false);
      }
    }
    else {
      local_54 = puVar14[1];
      if (8 < (ulong)(plVar13[1] - (long)puVar14)) {
        local_60 = puVar14[2];
        uVar15 = spv::Builder::getConstantScalar(this_00,puVar14[3]);
        IVar8 = *(Id *)(*plVar13 + 0x10);
        goto LAB_0044c391;
      }
    }
  }
  uVar15 = spv::Builder::getConstantScalar(this_00,local_58);
  uVar9 = spv::Builder::getConstantScalar(this_00,local_50);
  if (((uVar9 | uVar15) & 0xf000) != 0) {
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e1);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_78);
  }
  uVar15 = spv::Builder::getConstantScalar(this_00,local_60);
  if (uVar15 == 5) {
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e1);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_78);
  }
  if ((this->glslangIntermediate->useVulkanMemoryModel == true) &&
     (uVar15 = spv::Builder::getConstantScalar(this_00,local_60), uVar15 == 1)) {
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e2);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_78);
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_78,6);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
               (iterator)
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_48);
  }
  else {
    *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_48;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
               (iterator)
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_60);
  }
  else {
    *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_60;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
               (iterator)
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_58);
  }
  else {
    *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_58;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (bVar6) {
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                 (iterator)
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_50;
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                 (iterator)
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_54);
    }
    else {
      *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_54;
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar15 = local_4c;
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      puVar14 = &local_4c;
LAB_0044c3cb:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                 (iterator)
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar14);
      goto LAB_0044c3d0;
    }
  }
  else {
    if (((byte)local_5c & local_88 & local_8c) != 1) goto LAB_0044c3d0;
    uVar15 = local_54;
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      puVar14 = &local_54;
      goto LAB_0044c3cb;
    }
  }
  *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_finish = uVar15;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish + 1;
LAB_0044c3d0:
  if (bVar5) {
    spv::Builder::createNoResultOp(this_00,OpAtomicStore,&local_78);
    IVar8 = 0;
  }
  else {
    IVar8 = spv::Builder::createOp(this_00,local_7c,typeId_00,&local_78);
    if ((int)local_40 == 0x139) {
      IVar10 = spv::Builder::makeIntegerType(this_00,0x20,true);
      IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,1,false);
      IVar8 = spv::Builder::createBinOp(this_00,OpISub,typeId_00,IVar8,IVar10);
    }
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar8;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator op, spv::Decoration /*precision*/,
    spv::Id typeId, std::vector<spv::Id>& operands, glslang::TBasicType typeProxy,
    const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags, const glslang::TType &opType)
{
    spv::Op opCode = spv::OpNop;

    switch (op) {
    case glslang::EOpAtomicAdd:
    case glslang::EOpImageAtomicAdd:
    case glslang::EOpAtomicCounterAdd:
        opCode = spv::OpAtomicIAdd;
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFAddEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_add);
                if (typeProxy == glslang::EbtFloat16) {
                    builder.addExtension(spv::E_SPV_EXT_shader_atomic_float16_add);
                    builder.addCapability(spv::CapabilityAtomicFloat16AddEXT);
                } else if (typeProxy == glslang::EbtFloat) {
                    builder.addCapability(spv::CapabilityAtomicFloat32AddEXT);
                } else {
                    builder.addCapability(spv::CapabilityAtomicFloat64AddEXT);
                }
            }
        }
        break;
    case glslang::EOpAtomicSubtract:
    case glslang::EOpAtomicCounterSubtract:
        opCode = spv::OpAtomicISub;
        break;
    case glslang::EOpAtomicMin:
    case glslang::EOpImageAtomicMin:
    case glslang::EOpAtomicCounterMin:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMinEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMin;
        } else {
            opCode = spv::OpAtomicSMin;
        }
        break;
    case glslang::EOpAtomicMax:
    case glslang::EOpImageAtomicMax:
    case glslang::EOpAtomicCounterMax:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMaxEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMax;
        } else {
            opCode = spv::OpAtomicSMax;
        }
        break;
    case glslang::EOpAtomicAnd:
    case glslang::EOpImageAtomicAnd:
    case glslang::EOpAtomicCounterAnd:
        opCode = spv::OpAtomicAnd;
        break;
    case glslang::EOpAtomicOr:
    case glslang::EOpImageAtomicOr:
    case glslang::EOpAtomicCounterOr:
        opCode = spv::OpAtomicOr;
        break;
    case glslang::EOpAtomicXor:
    case glslang::EOpImageAtomicXor:
    case glslang::EOpAtomicCounterXor:
        opCode = spv::OpAtomicXor;
        break;
    case glslang::EOpAtomicExchange:
    case glslang::EOpImageAtomicExchange:
    case glslang::EOpAtomicCounterExchange:
        if ((typeProxy == glslang::EbtFloat16) && 
            (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
        }

        opCode = spv::OpAtomicExchange;
        break;
    case glslang::EOpAtomicCompSwap:
    case glslang::EOpImageAtomicCompSwap:
    case glslang::EOpAtomicCounterCompSwap:
        opCode = spv::OpAtomicCompareExchange;
        break;
    case glslang::EOpAtomicCounterIncrement:
        opCode = spv::OpAtomicIIncrement;
        break;
    case glslang::EOpAtomicCounterDecrement:
        opCode = spv::OpAtomicIDecrement;
        break;
    case glslang::EOpAtomicCounter:
    case glslang::EOpImageAtomicLoad:
    case glslang::EOpAtomicLoad:
        opCode = spv::OpAtomicLoad;
        break;
    case glslang::EOpAtomicStore:
    case glslang::EOpImageAtomicStore:
        opCode = spv::OpAtomicStore;
        break;
    default:
        assert(0);
        break;
    }

    if (typeProxy == glslang::EbtInt64 || typeProxy == glslang::EbtUint64)
        builder.addCapability(spv::CapabilityInt64Atomics);

    // Sort out the operands
    //  - mapping from glslang -> SPV
    //  - there are extra SPV operands that are optional in glslang
    //  - compare-exchange swaps the value and comparator
    //  - compare-exchange has an extra memory semantics
    //  - EOpAtomicCounterDecrement needs a post decrement
    spv::Id pointerId = 0, compareId = 0, valueId = 0;
    // scope defaults to Device in the old model, QueueFamilyKHR in the new model
    spv::Id scopeId;
    if (glslangIntermediate->usingVulkanMemoryModel()) {
        scopeId = builder.makeUintConstant(spv::ScopeQueueFamilyKHR);
    } else {
        scopeId = builder.makeUintConstant(spv::ScopeDevice);
    }
    // semantics default to relaxed
    spv::Id semanticsId = builder.makeUintConstant(lvalueCoherentFlags.isVolatile() &&
        glslangIntermediate->usingVulkanMemoryModel() ?
                                                    spv::MemorySemanticsVolatileMask :
                                                    spv::MemorySemanticsMaskNone);
    spv::Id semanticsId2 = semanticsId;

    pointerId = operands[0];
    if (opCode == spv::OpAtomicIIncrement || opCode == spv::OpAtomicIDecrement) {
        // no additional operands
    } else if (opCode == spv::OpAtomicCompareExchange) {
        compareId = operands[1];
        valueId = operands[2];
        if (operands.size() > 3) {
            scopeId = operands[3];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[4]) | builder.getConstantScalar(operands[5]));
            semanticsId2 = builder.makeUintConstant(
                builder.getConstantScalar(operands[6]) | builder.getConstantScalar(operands[7]));
        }
    } else if (opCode == spv::OpAtomicLoad) {
        if (operands.size() > 1) {
            scopeId = operands[1];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[2]) | builder.getConstantScalar(operands[3]));
        }
    } else {
        // atomic store or RMW
        valueId = operands[1];
        if (operands.size() > 2) {
            scopeId = operands[2];
            semanticsId = builder.makeUintConstant
                (builder.getConstantScalar(operands[3]) | builder.getConstantScalar(operands[4]));
        }
    }

    // Check for capabilities
    unsigned semanticsImmediate = builder.getConstantScalar(semanticsId) | builder.getConstantScalar(semanticsId2);
    if (semanticsImmediate & (spv::MemorySemanticsMakeAvailableKHRMask |
                              spv::MemorySemanticsMakeVisibleKHRMask |
                              spv::MemorySemanticsOutputMemoryKHRMask |
                              spv::MemorySemanticsVolatileMask)) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (builder.getConstantScalar(scopeId) == spv::ScopeQueueFamily) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (glslangIntermediate->usingVulkanMemoryModel() && builder.getConstantScalar(scopeId) == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    std::vector<spv::Id> spvAtomicOperands;  // hold the spv operands
    spvAtomicOperands.reserve(6);
    spvAtomicOperands.push_back(pointerId);
    spvAtomicOperands.push_back(scopeId);
    spvAtomicOperands.push_back(semanticsId);
    if (opCode == spv::OpAtomicCompareExchange) {
        spvAtomicOperands.push_back(semanticsId2);
        spvAtomicOperands.push_back(valueId);
        spvAtomicOperands.push_back(compareId);
    } else if (opCode != spv::OpAtomicLoad && opCode != spv::OpAtomicIIncrement && opCode != spv::OpAtomicIDecrement) {
        spvAtomicOperands.push_back(valueId);
    }

    if (opCode == spv::OpAtomicStore) {
        builder.createNoResultOp(opCode, spvAtomicOperands);
        return 0;
    } else {
        spv::Id resultId = builder.createOp(opCode, typeId, spvAtomicOperands);

        // GLSL and HLSL atomic-counter decrement return post-decrement value,
        // while SPIR-V returns pre-decrement value. Translate between these semantics.
        if (op == glslang::EOpAtomicCounterDecrement)
            resultId = builder.createBinOp(spv::OpISub, typeId, resultId, builder.makeIntConstant(1));

        return resultId;
    }
}